

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O2

AggressorAccessPattern * __thiscall
HammeringPattern::get_access_pattern_by_aggressor(HammeringPattern *this,Aggressor *agg)

{
  AggressorAccessPattern *aap;
  AggressorAccessPattern *pAVar1;
  string local_60;
  string local_40;
  allocator<char> local_19;
  
  pAVar1 = (this->agg_access_patterns).
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pAVar1 == (this->agg_access_patterns).
                  super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,
                 "Could not find AggressorAccessPattern whose first aggressor has id %s.",&local_19)
      ;
      format_string<int>(&local_40,&local_60,agg->id);
      Logger::log_error(&local_40,true);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      exit(1);
    }
    if (((pAVar1->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
         super__Vector_impl_data._M_start)->id == agg->id) break;
    pAVar1 = pAVar1 + 1;
  }
  return pAVar1;
}

Assistant:

AggressorAccessPattern &HammeringPattern::get_access_pattern_by_aggressor(Aggressor &agg) {
  // iterate over the AggressorAccessPatterns and return the *first* AggressorAccessPattern that has the given Aggressor
  // agg as its *first* Aggressor
  for (auto &aap : agg_access_patterns) {
    if (aap.aggressors[0].id==agg.id) return aap;
  }
  Logger::log_error(format_string("Could not find AggressorAccessPattern whose first aggressor has id %s.", agg.id));
  exit(1);
}